

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O3

char * Kit_PlaFromTruthNew(uint *pTruth,int nVars,Vec_Int_t *vCover,Vec_Str_t *vStr)

{
  char cVar1;
  size_t __size;
  uint uVar2;
  char *pcVar3;
  ABC_UINT64_T AVar4;
  char *pcVar5;
  ABC_UINT64_T AVar6;
  int i;
  long lVar7;
  int iVar8;
  ulong uVar9;
  
  uVar2 = Kit_TruthIsop(pTruth,nVars,vCover,1);
  if (1 < uVar2) {
    __assert_fail("RetValue == 0 || RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                  ,0x19b,"char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)")
    ;
  }
  iVar8 = vCover->nSize;
  if ((iVar8 == 0) || ((iVar8 == 1 && (*vCover->pArray == 0)))) {
    if (uVar2 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                    ,0x19f,
                    "char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)");
    }
    vStr->nSize = 0;
    pcVar3 = " 1\n";
    if (iVar8 == 0) {
      pcVar3 = " 0\n";
    }
    uVar9 = 0;
    lVar7 = 0;
    do {
      cVar1 = pcVar3[lVar7];
      iVar8 = (int)uVar9;
      if (iVar8 == vStr->nCap) {
        if (iVar8 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar5;
          vStr->nCap = 0x10;
        }
        else {
          uVar2 = iVar8 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc((ulong)uVar2);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,(ulong)uVar2);
          }
          vStr->pArray = pcVar5;
          vStr->nCap = uVar2;
        }
      }
      else {
        pcVar5 = vStr->pArray;
      }
      iVar8 = vStr->nSize;
      vStr->nSize = iVar8 + 1;
      pcVar5[iVar8] = cVar1;
      lVar7 = lVar7 + 1;
      uVar2 = vStr->nSize;
      uVar9 = (ulong)uVar2;
    } while (lVar7 != 3);
    if (uVar2 == vStr->nCap) {
      if ((int)uVar2 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc(0x10);
        }
        else {
          pcVar3 = (char *)realloc(vStr->pArray,0x10);
        }
        vStr->pArray = pcVar3;
        vStr->nCap = 0x10;
      }
      else {
        __size = uVar9 * 2;
        if (vStr->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc(__size);
        }
        else {
          pcVar3 = (char *)realloc(vStr->pArray,__size);
        }
        vStr->pArray = pcVar3;
        vStr->nCap = (int)__size;
      }
    }
    else {
      pcVar3 = vStr->pArray;
    }
    iVar8 = vStr->nSize;
    vStr->nSize = iVar8 + 1;
    pcVar3[iVar8] = '\0';
    pcVar3 = vStr->pArray;
  }
  else {
    pcVar3 = Kit_PlaFromIsop(vStr,nVars,vCover);
    if (uVar2 != 0) {
      Kit_PlaComplement(pcVar3);
    }
    if (nVars < 6) {
      uVar2 = *pTruth;
      AVar4 = Kit_PlaToTruth6(pcVar3,nVars);
      if (uVar2 != (uint)AVar4) {
        __assert_fail("pTruth[0] == (unsigned)Kit_PlaToTruth6(pResult, nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                      ,0x1a9,
                      "char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)");
      }
    }
    else if (nVars == 6) {
      AVar4 = *(ABC_UINT64_T *)pTruth;
      AVar6 = Kit_PlaToTruth6(pcVar3,6);
      if (AVar4 != AVar6) {
        __assert_fail("*((ABC_UINT64_T*)pTruth) == Kit_PlaToTruth6(pResult, nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                      ,0x1ab,
                      "char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)");
      }
    }
  }
  return pcVar3;
}

Assistant:

char * Kit_PlaFromTruthNew( unsigned * pTruth, int nVars, Vec_Int_t * vCover, Vec_Str_t * vStr )
{
    char * pResult;
    // transform truth table into the SOP
    int RetValue = Kit_TruthIsop( pTruth, nVars, vCover, 1 );
    assert( RetValue == 0 || RetValue == 1 );
    // check the case of constant cover
    if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
    {
        assert( RetValue == 0 );
        Vec_StrClear( vStr );
        Vec_StrAppend( vStr, (Vec_IntSize(vCover) == 0) ? " 0\n" : " 1\n" );
        Vec_StrPush( vStr, '\0' );
        return Vec_StrArray( vStr );
    }
    pResult = Kit_PlaFromIsop( vStr, nVars, vCover );
    if ( RetValue )
        Kit_PlaComplement( pResult );
    if ( nVars < 6 )
        assert( pTruth[0] == (unsigned)Kit_PlaToTruth6(pResult, nVars) );
    else if ( nVars == 6 )
        assert( *((ABC_UINT64_T*)pTruth) == Kit_PlaToTruth6(pResult, nVars) );
    return pResult;
}